

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::bnb_sffo_restriction::test_method(bnb_sffo_restriction *this)

{
  CAmount CVar1;
  T *pTVar2;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar3;
  iterator pvVar4;
  iterator pvVar5;
  CCoinControl *coin_control;
  long in_FS_OFFSET;
  bool bVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffb30;
  uint uVar8;
  unique_lock<std::recursive_mutex> *puVar7;
  int in_stack_fffffffffffffb38;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  undefined1 local_3f8 [12];
  uint32_t uStack_3ec;
  SignalInterrupt *local_3e8;
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> _Stack_3e0;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_3d8;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> _Stack_3d0;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_3c8;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_3c0;
  __uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> local_3b8;
  int iStack_3b0;
  bool bStack_3ac;
  undefined2 uStack_3ab;
  __uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> local_3a8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  Result<wallet::SelectionResult> result;
  CoinsResult available_coins;
  FastRandomContext rand;
  undefined1 local_248 [464];
  undefined1 local_78 [8];
  _Rb_tree_node_base _Stack_70;
  size_t local_50;
  CAmount CStack_48;
  long local_38;
  
  uVar8 = (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"",(allocator<char> *)&rand);
  NewWallet((NodeContext *)&wallet,
            (string *)
            &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node);
  std::__cxx11::string::~string((string *)local_248);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_248,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)wallet._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0x1cf,false);
  *(undefined4 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x108) = 300;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xf0) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0xf8) = 0;
  *(undefined8 *)
   ((long)wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
          _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x100) = 0;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_248);
  FastRandomContext::FastRandomContext(&rand,false);
  stack0xfffffffffffffc10 = (Init *)0x440000001f;
  local_3e8 = (SignalInterrupt *)0x0;
  _Stack_3e0._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
       (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
  local_3d8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       (_Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>)0x0;
  _Stack_3d0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
       (_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>)0x0;
  local_3c8._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
       (_Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)0xbb8
  ;
  local_3c0._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
       (_Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)0x3e8
  ;
  local_3b8._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)
       (_Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>)0x3e8;
  local_3a8._M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (tuple<BanMan_*,_std::default_delete<BanMan>_>)
       (_Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>)0x0;
  uStack_3ab._0_1_ = false;
  uStack_3ab._1_1_ = false;
  iStack_3b0 = 0;
  bStack_3ac = true;
  local_3f8._0_8_ = &rand;
  local_3d8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       CFeeRate::GetFee((CFeeRate *)&local_3c8,0x1f);
  CVar1 = CFeeRate::GetFee((CFeeRate *)&local_3b8,uStack_3ec);
  _Stack_3d0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
       ((long)local_3d8._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
              super__Head_base<0UL,_CConnman_*,_false>._M_head_impl + CVar1);
  local_3e8 = (SignalInterrupt *)
              ((long)local_3d8._M_t.
                     super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
                     super__Head_base<0UL,_CConnman_*,_false>._M_head_impl + CVar1 + 1);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  local_248._0_8_ =
       CVar1 + (long)local_3d8._M_t.
                     super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
                     super__Head_base<0UL,_CConnman_*,_false>._M_head_impl + 100000000;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           (CFeeRate)
           local_3c8._M_t.
           super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
           .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl,6,true,1,false,
           in_stack_fffffffffffffb38);
  local_248._0_8_ =
       (undefined8)
       ((double)(long)_Stack_3d0._M_t.
                      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl + 50000000.0);
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           (CFeeRate)
           local_3c8._M_t.
           super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
           .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl,6,true,1,false,
           in_stack_fffffffffffffb38);
  local_248._0_8_ = (mutex_type *)0x2faf080;
  _cVar9 = (check_type)((ulong)uVar8 << 0x20);
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)local_248,
           (CFeeRate)
           local_3c8._M_t.
           super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
           .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl,6,true,1,false,
           in_stack_fffffffffffffb38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((long)wallet._M_t.
                    super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                    .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0x1e8,false);
  _Stack_70._M_left = &_Stack_70;
  _Stack_70._M_parent = (_Base_ptr)0x0;
  local_78 = (undefined1  [8])0x0;
  _Stack_70._0_8_ = (element_type *)0x0;
  local_50 = 0;
  CStack_48 = 0;
  _Stack_70._M_right = _Stack_70._M_left;
  CCoinControl::CCoinControl((CCoinControl *)local_248);
  pvVar4 = "";
  coin_control = (CCoinControl *)local_248;
  SelectCoins(&result,(CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&available_coins
              ,(PreSelectedInputs *)local_78,&COIN,coin_control,(CoinSelectionParams *)local_3f8);
  CCoinControl::~CCoinControl((CCoinControl *)local_248);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)local_78);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1e9;
  file.m_begin = (iterator)&local_410;
  msg.m_end = (iterator)coin_control;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_420,msg);
  _Stack_70._0_8_ = (element_type *)0x0;
  _Stack_70._M_parent = (_Base_ptr)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_d66d32;
  criticalblock11.super_unique_lock._8_8_ = (long)"result.has_value()" + 0x12;
  local_248[8] = false;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_428 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_248._24_8_ = &criticalblock11.super_unique_lock;
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index ==
                '\x01');
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_430,0x1e9);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_70._M_parent);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ea;
  file_00.m_begin = (iterator)&local_440;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_450,
             msg_00);
  local_248[8] = false;
  local_248._0_8_ = &PTR__lazy_ostream_011480b0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_248._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_458 = "";
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  local_78[0] = (class_property<bool>)pTVar2->m_algo;
  pvVar4 = local_78;
  criticalblock11.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock11.super_unique_lock._M_device & 0xffffffffffffff00);
  pvVar5 = (iterator)0x3;
  puVar7 = &criticalblock11.super_unique_lock;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,wallet::SelectionAlgorithm,wallet::SelectionAlgorithm>
            (local_248,&local_460,0x1ea,1,3,pvVar4,"result->GetAlgo()",
             &criticalblock11.super_unique_lock,"SelectionAlgorithm::BNB");
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1eb;
  file_01.m_begin = (iterator)&local_470;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_480,
             msg_01);
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  psVar3 = SelectionResult::GetInputSet(pTVar2);
  local_78[0] = (class_property<bool>)
                (class_property<bool>)
                ((psVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2);
  _Stack_70._0_8_ = (element_type *)0x0;
  _Stack_70._M_parent = (_Base_ptr)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_169bc04;
  criticalblock11.super_unique_lock._8_8_ = (long)"result->GetInputSet().size() == 2" + 0x21;
  local_248[8] = false;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_488 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_248._24_8_ = &criticalblock11.super_unique_lock;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,(check_type)puVar7,
             (size_t)&local_490,0x1eb);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_70._M_parent);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1ed;
  file_02.m_begin = (iterator)&local_4a0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4b0,
             msg_02);
  pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
  bVar6 = true;
  if (pTVar2->m_algo != SRD) {
    pTVar2 = util::Result<wallet::SelectionResult>::value(&result);
    bVar6 = pTVar2->m_algo == KNAPSACK;
  }
  local_78[0] = (class_property<bool>)(class_property<bool>)bVar6;
  _Stack_70._0_8_ = (element_type *)0x0;
  _Stack_70._M_parent = (_Base_ptr)0x0;
  criticalblock11.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_169bc1e;
  criticalblock11.super_unique_lock._8_8_ =
       (long)
       "result->GetAlgo() == SelectionAlgorithm::SRD || result->GetAlgo() == SelectionAlgorithm::KNAPSACK"
       + 0x61;
  local_248[8] = false;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4b8 = "";
  local_248._24_8_ = &criticalblock11.super_unique_lock;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_248,1,0,WARN,(check_type)puVar7,
             (size_t)&local_4c0,0x1ed);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_70._M_parent);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  ChaCha20::~ChaCha20(&rand.rng);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bnb_sffo_restriction)
{
    // Verify the coin selection process does not produce a BnB solution when SFFO is enabled.
    // This is currently problematic because it could require a change output. And BnB is specialized on changeless solutions.
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    WITH_LOCK(wallet->cs_wallet, wallet->SetLastBlockProcessed(300, uint256{})); // set a high block so internal UTXOs are selectable

    FastRandomContext rand{};
    CoinSelectionParams params{
            rand,
            /*change_output_size=*/ 31,  // unused value, p2wpkh output size (wallet default change type)
            /*change_spend_size=*/ 68,   // unused value, p2wpkh input size (high-r signature)
            /*min_change_target=*/ 0,    // dummy, set later
            /*effective_feerate=*/ CFeeRate(3000),
            /*long_term_feerate=*/ CFeeRate(1000),
            /*discard_feerate=*/ CFeeRate(1000),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ false,
    };
    params.m_subtract_fee_outputs = true;
    params.m_change_fee = params.m_effective_feerate.GetFee(params.change_output_size);
    params.m_cost_of_change = params.m_discard_feerate.GetFee(params.change_spend_size) + params.m_change_fee;
    params.m_min_change_target = params.m_cost_of_change + 1;
    // Add spendable coin at the BnB selection upper bound
    CoinsResult available_coins;
    add_coin(available_coins, *wallet, COIN + params.m_cost_of_change, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    add_coin(available_coins, *wallet, 0.5 * COIN + params.m_cost_of_change, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    add_coin(available_coins, *wallet, 0.5 * COIN, /*feerate=*/params.m_effective_feerate, /*nAge=*/6, /*fIsFromMe=*/true, /*nInput=*/0, /*spendable=*/true);
    // Knapsack will only find a changeless solution on an exact match to the satoshi, SRD doesn’t look for changeless
    // If BnB were run, it would produce a single input solution with the best waste score
    auto result = WITH_LOCK(wallet->cs_wallet, return SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, COIN, /*coin_control=*/{}, params));
    BOOST_CHECK(result.has_value());
    BOOST_CHECK_NE(result->GetAlgo(), SelectionAlgorithm::BNB);
    BOOST_CHECK(result->GetInputSet().size() == 2);
    // We have only considered BnB, SRD, and Knapsack. Test needs to be reevaluated if new algo is added
    BOOST_CHECK(result->GetAlgo() == SelectionAlgorithm::SRD || result->GetAlgo() == SelectionAlgorithm::KNAPSACK);
}